

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_zeroing<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,false>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  node_ptr next;
  _Hash_node_base *p_Var13;
  ulong uVar14;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>
  m;
  shared_count sStack_2c0;
  char *local_2b8;
  char *local_2b0;
  Delete_disposer local_2a8;
  undefined1 local_2a0;
  undefined8 *local_298;
  char **local_290;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_288;
  undefined1 local_270 [64];
  __buckets_ptr local_230;
  ulong local_228;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,false>>>>
            ();
  local_270._0_8_ = operator_new(0x38);
  (((Column_settings *)local_270._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((Column_settings *)local_270._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  (((Column_settings *)local_270._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  (((Column_settings *)local_270._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
  (((Column_settings *)local_270._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  (((Column_settings *)local_270._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  (((Column_settings *)local_270._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,false>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,false>>>
              *)(local_270 + 8),&local_288,(Column_settings *)local_270._0_8_);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x26d);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_228;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar5,0);
  if (local_230[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_230[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var13 = p_Var2 + 7;
        goto LAB_00164670;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_228 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var13[2]._M_nxt != 1) {
LAB_00164670:
    p_Var13 = p_Var13->_M_nxt;
    if (p_Var13 == p_Var2 + 7) break;
  }
  sStack_2c0.pi_ = (sp_counted_base *)0x0;
  local_2b8 = "!m.is_zero_entry(3, 1)";
  local_2b0 = "";
  local_2a0 = 0;
  local_2a8.col_ =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>
        *)&PTR__lazy_ostream_001dd2e8;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_290 = &local_2b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2c0);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x26e);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_228;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0);
  if (local_230[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_230[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_2c0.pi_ = (sp_counted_base *)0x0;
        local_2b8 = "!m.is_zero_column(3)";
        local_2b0 = "";
        local_2a0 = 0;
        local_2a8.col_ =
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>
              *)&PTR__lazy_ostream_001dd2e8;
        local_298 = &boost::unit_test::lazy_ostream::inst;
        local_90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_88 = "";
        local_290 = &local_2b8;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_2c0);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_228;
        uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar7,0);
        if (local_230[uVar14 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_00164db8;
        p_Var2 = local_230[uVar14 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x00164856;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_228 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var13[2]._M_nxt != 1) {
LAB_00164888:
    p_Var13 = p_Var13->_M_nxt;
    if (p_Var13 == p_Var2 + 7) goto LAB_001648bb;
  }
  p_Var3 = p_Var13->_M_nxt;
  p_Var4 = p_Var13[1]._M_nxt;
  p_Var4->_M_nxt = p_Var3;
  p_Var3[1]._M_nxt = p_Var4;
  p_Var13->_M_nxt = (_Hash_node_base *)0x0;
  p_Var13[1]._M_nxt = (_Hash_node_base *)0x0;
  local_2a8.col_ =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>
        *)(p_Var2 + 2);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>
  ::Delete_disposer::operator()(&local_2a8,(Entry *)(p_Var13 + -3));
LAB_001648bb:
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x270);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_228;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar8,0);
  if (local_230[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_230[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var13 = p_Var2 + 7;
        goto LAB_0016494b;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_228 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var13[2]._M_nxt != 1) {
LAB_0016494b:
    p_Var13 = p_Var13->_M_nxt;
    if (p_Var13 == p_Var2 + 7) break;
  }
  sStack_2c0.pi_ = (sp_counted_base *)0x0;
  local_2b8 = "m.is_zero_entry(3, 1)";
  local_2b0 = "";
  local_2a0 = 0;
  local_2a8.col_ =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>
        *)&PTR__lazy_ostream_001dd2e8;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_290 = &local_2b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2c0);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x271);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_228;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar9,0);
  if (local_230[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_230[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_2c0.pi_ = (sp_counted_base *)0x0;
        local_2b8 = "!m.is_zero_column(3)";
        local_2b0 = "";
        local_2a0 = 0;
        local_2a8.col_ =
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>
              *)&PTR__lazy_ostream_001dd2e8;
        local_298 = &boost::unit_test::lazy_ostream::inst;
        local_f0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_e8 = "";
        local_290 = &local_2b8;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_2c0);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_228;
        uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar10,0);
        if (local_230[uVar14 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_00164db8;
        p_Var2 = local_230[uVar14 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x00164b2d;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_228 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_228 == uVar14))) {
joined_r0x00164856:
    if (uVar1 == 3) {
      p_Var13 = p_Var2 + 7;
      goto LAB_00164888;
    }
  }
LAB_00164db8:
  std::__throw_out_of_range("_Map_base::at");
joined_r0x00164b2d:
  if (uVar1 != 3) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_228 != uVar14)) goto LAB_00164db8;
    goto joined_r0x00164b2d;
  }
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,false>>>::Delete_disposer>
            ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              *)(p_Var2 + 7),
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>
              *)(p_Var2 + 2));
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x273);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_228;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar11,0);
  if (local_230[uVar14 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_00164df4;
  p_Var2 = local_230[uVar14 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var2[1]._M_nxt;
  while (uVar1 != 3) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_228 != uVar14)) {
LAB_00164df4:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  p_Var13 = p_Var2 + 7;
  do {
    p_Var13 = p_Var13->_M_nxt;
    if (p_Var13 == p_Var2 + 7) break;
  } while (*(int *)&p_Var13[2]._M_nxt != 1);
  sStack_2c0.pi_ = (sp_counted_base *)0x0;
  local_2b8 = "m.is_zero_entry(3, 1)";
  local_2b0 = "";
  local_2a0 = 0;
  local_2a8.col_ =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>
        *)&PTR__lazy_ostream_001dd2e8;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_290 = &local_2b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2c0);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x274);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_228;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar12,0);
  if (local_230[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_230[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_2c0.pi_ = (sp_counted_base *)0x0;
        local_2b8 = "m.is_zero_column(3)";
        local_2b0 = "";
        local_2a0 = 0;
        local_2a8.col_ =
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>
              *)&PTR__lazy_ostream_001dd2e8;
        local_298 = &boost::unit_test::lazy_ostream::inst;
        local_150 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_148 = "";
        local_290 = &local_2b8;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_2c0);
        Gudhi::persistence_matrix::
        Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>
        ::~Matrix((Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>
                   *)local_270);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_288);
        return;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_228 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_zeroing() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  Matrix m(orderedBoundaries, 5);

  BOOST_CHECK(!m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_entry(3, 1);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_column(3);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(m.is_zero_column(3));
}